

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1b8a13::CAPIBuildSystemFrontendDelegate::
commandCannotBuildOutputDueToMissingInputs
          (CAPIBuildSystemFrontendDelegate *this,Command *command,Node *outputNode,
          ArrayRef<llbuild::buildsystem::BuildKey> inputKeys)

{
  _func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_build_key_t_ptr_ptr_llb_build_key_t_ptr_ptr_uint64_t
  *p_Var1;
  void *pvVar2;
  CAPIBuildKey *this_00;
  size_t sVar3;
  llb_build_key_t **pplVar4;
  uint64_t uVar5;
  StringRef path;
  undefined1 local_c0 [8];
  CAPIBuildKeysVector inputs;
  char *local_a0;
  BuildKey local_98;
  StringRef local_78;
  undefined1 local_68 [8];
  string str;
  CAPIBuildKey *output;
  Node *outputNode_local;
  Command *command_local;
  CAPIBuildSystemFrontendDelegate *this_local;
  ArrayRef<llbuild::buildsystem::BuildKey> inputKeys_local;
  
  if ((this->cAPIDelegate).command_cannot_build_output_due_to_missing_inputs !=
      (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_build_key_t_ptr_ptr_llb_build_key_t_ptr_ptr_uint64_t
       *)0x0) {
    str.field_2._8_8_ = 0;
    if (outputNode != (Node *)0x0) {
      local_78 = llbuild::buildsystem::Node::getName(outputNode);
      llvm::StringRef::str_abi_cxx11_((string *)local_68,&local_78);
      this_00 = (CAPIBuildKey *)operator_new(0x38);
      inputs.keys.
      super__Vector_base<(anonymous_namespace)::CAPIBuildKey_*,_std::allocator<(anonymous_namespace)::CAPIBuildKey_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)std::__cxx11::string::data();
      sVar3 = std::__cxx11::string::length();
      path.Length = sVar3;
      path.Data = local_a0;
      llbuild::buildsystem::BuildKey::makeNode
                (&local_98,
                 (BuildKey *)
                 inputs.keys.
                 super__Vector_base<(anonymous_namespace)::CAPIBuildKey_*,_std::allocator<(anonymous_namespace)::CAPIBuildKey_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,path);
      CAPIBuildKey::CAPIBuildKey(this_00,&local_98);
      str.field_2._8_8_ = this_00;
      llbuild::buildsystem::BuildKey::~BuildKey(&local_98);
      std::__cxx11::string::~string((string *)local_68);
    }
    CAPIBuildKeysVector::CAPIBuildKeysVector((CAPIBuildKeysVector *)local_c0,inputKeys);
    p_Var1 = (this->cAPIDelegate).command_cannot_build_output_due_to_missing_inputs;
    pvVar2 = (this->cAPIDelegate).context;
    pplVar4 = CAPIBuildKeysVector::data((CAPIBuildKeysVector *)local_c0);
    uVar5 = CAPIBuildKeysVector::count((CAPIBuildKeysVector *)local_c0);
    (*p_Var1)(pvVar2,(llb_buildsystem_command_t *)command,
              (llb_build_key_t **)((long)&str.field_2 + 8),pplVar4,uVar5);
    llb_build_key_destroy((llb_build_key_t *)str.field_2._8_8_);
    CAPIBuildKeysVector::~CAPIBuildKeysVector((CAPIBuildKeysVector *)local_c0);
  }
  return;
}

Assistant:

virtual void commandCannotBuildOutputDueToMissingInputs(Command* command,
               Node* outputNode, ArrayRef<BuildKey> inputKeys) override {
    if (cAPIDelegate.command_cannot_build_output_due_to_missing_inputs) {
      CAPIBuildKey *output = nullptr;
      if (outputNode) {
        auto str = outputNode->getName().str();
        output = new CAPIBuildKey(BuildKey::makeNode(str));
      }

      CAPIBuildKeysVector inputs(inputKeys);

      cAPIDelegate.command_cannot_build_output_due_to_missing_inputs(
        cAPIDelegate.context,
        (llb_buildsystem_command_t*) command,
        (llb_build_key_t **)&output,
        inputs.data(),
        inputs.count()
      );

      llb_build_key_destroy((llb_build_key_t *)output);
    }
  }